

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_class_block(Parser *parser)

{
  List *list;
  void *data;
  BlockStmt *pBVar1;
  bool bVar2;
  List *stmts;
  Parser *parser_local;
  
  expect(parser,OP_FL_BRA);
  break_newline(parser);
  list = new_list();
  while( true ) {
    bVar2 = false;
    if (parser->token->kind != CL_FL_BRA) {
      bVar2 = parser->token->kind != END;
    }
    if (!bVar2) break;
    data = parse_stmt(parser);
    list_add(list,data);
    bmove(parser);
  }
  expect(parser,CL_FL_BRA);
  pBVar1 = new_block_stmt(list);
  return pBVar1;
}

Assistant:

void *parse_class_block(Parser *parser) {
    expect(parser, OP_FL_BRA);
    break_newline(parser);
    List *stmts = new_list();
    while (token(parser)->kind != CL_FL_BRA && token(parser)->kind != END) {
        list_add(stmts, parse_stmt(parser));
        bmove(parser);
    }
    expect(parser, CL_FL_BRA);
    return new_block_stmt(stmts);
}